

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_haddps_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  float_status *s_00;
  float32 fVar1;
  float32 fVar2;
  float32 fVar3;
  float32 fVar4;
  
  s_00 = &env->sse_status;
  fVar1 = float32_add_x86_64(d->_s_ZMMReg[0],d->_s_ZMMReg[1],s_00);
  fVar2 = float32_add_x86_64(d->_s_ZMMReg[2],d->_s_ZMMReg[3],s_00);
  fVar3 = float32_add_x86_64(s->_s_ZMMReg[0],s->_s_ZMMReg[1],s_00);
  fVar4 = float32_add_x86_64(s->_s_ZMMReg[2],s->_s_ZMMReg[3],s_00);
  d->_s_ZMMReg[0] = fVar1;
  d->_s_ZMMReg[1] = fVar2;
  d->_s_ZMMReg[2] = fVar3;
  d->_s_ZMMReg[3] = fVar4;
  return;
}

Assistant:

void helper_haddps(CPUX86State *env, ZMMReg *d, ZMMReg *s)
{
    ZMMReg r;

    r.ZMM_S(0) = float32_add(d->ZMM_S(0), d->ZMM_S(1), &env->sse_status);
    r.ZMM_S(1) = float32_add(d->ZMM_S(2), d->ZMM_S(3), &env->sse_status);
    r.ZMM_S(2) = float32_add(s->ZMM_S(0), s->ZMM_S(1), &env->sse_status);
    r.ZMM_S(3) = float32_add(s->ZMM_S(2), s->ZMM_S(3), &env->sse_status);
    *d = r;
}